

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  undefined4 uVar41;
  uint uVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  int iVar46;
  size_t sVar47;
  ulong uVar48;
  int iVar49;
  undefined1 (*pauVar50) [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar76;
  float fVar77;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar91;
  float fVar100;
  float fVar101;
  Vec3fa dn1;
  float fVar102;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar103;
  float fVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  undefined1 auVar110 [64];
  vfloat4 b0;
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  float fVar116;
  float fVar120;
  float fVar121;
  vfloat4 a0_1;
  float fVar122;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar123;
  undefined1 auVar119 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar127 [16];
  float fVar129;
  float fVar132;
  undefined1 auVar128 [64];
  vfloat4 a0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar155;
  float fVar157;
  Vec3fa n0;
  undefined1 auVar153 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar154 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar163;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar172;
  float fVar174;
  float fVar175;
  Vec3fa n1;
  undefined1 auVar173 [16];
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar177 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  anon_class_16_2_07cfa4d6 local_318;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
  *local_2e0;
  float local_2d4;
  size_t local_2d0;
  size_t local_2c8;
  range<unsigned_long> *local_2c0;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  PrimInfo *local_230;
  PrimRef *local_228;
  ulong local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar51._8_8_ = 0;
  auVar51._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar51._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar67._8_8_ = 0;
  auVar67._0_4_ = time_range->lower;
  auVar67._4_4_ = time_range->upper;
  auVar52 = vcmpps_avx(auVar51,auVar67,1);
  auVar127 = vinsertps_avx(auVar67,auVar51,0x50);
  auVar51 = vinsertps_avx(auVar51,auVar67,0x50);
  local_1c8 = vblendvps_avx(auVar51,auVar127,auVar52);
  auVar110 = ZEXT1664(local_1c8);
  local_1d8 = vmovshdup_avx(local_1c8);
  auVar115 = ZEXT1664(local_1d8);
  if (local_1c8._0_4_ <= local_1d8._0_4_) {
    uVar48 = r->_begin;
    local_268 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_278 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_288 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_298 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_2d0 = __return_storage_ptr__->end;
    local_230 = __return_storage_ptr__;
    if (uVar48 < r->_end) {
      auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
      local_2e0 = this;
      local_2c8 = k;
      local_2c0 = r;
      local_228 = prims;
      do {
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar52._8_8_ = 0;
        auVar52._0_4_ = BVar2.lower;
        auVar52._4_4_ = BVar2.upper;
        auVar52 = vmovshdup_avx(auVar52);
        fVar76 = BVar2.lower;
        fVar66 = auVar52._0_4_ - fVar76;
        uVar42 = *(uint *)(*(long *)&(this->
                                     super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar48);
        uVar38 = (ulong)uVar42;
        uVar39 = (ulong)(uVar42 + 1);
        pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar39 < (pBVar3->super_RawBufferView).num) {
          fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                  super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar52 = ZEXT416((uint)(fVar1 * ((auVar110._0_4_ - fVar76) / fVar66) * 1.0000002));
          auVar52 = vroundss_avx(auVar52,auVar52,9);
          auVar52 = vmaxss_avx(auVar128._0_16_,auVar52);
          uVar42 = (uint)auVar52._0_4_;
          auVar52 = ZEXT416((uint)(fVar1 * ((auVar115._0_4_ - fVar76) / fVar66) * 0.99999976));
          auVar52 = vroundss_avx(auVar52,auVar52,10);
          auVar52 = vminss_avx(auVar52,ZEXT416((uint)fVar1));
          uVar44 = (uint)auVar52._0_4_;
          bVar10 = uVar44 < uVar42;
          if (uVar42 <= uVar44) {
            uVar43 = (ulong)(int)uVar42;
            lVar45 = uVar43 * 0x38;
            pcVar4 = pBVar3[uVar43].super_RawBufferView.ptr_ofs;
            sVar47 = pBVar3[uVar43].super_RawBufferView.stride;
            auVar52 = *(undefined1 (*) [16])(pcVar4 + sVar47 * uVar38);
            auVar118._8_4_ = 0xddccb9a2;
            auVar118._0_8_ = 0xddccb9a2ddccb9a2;
            auVar118._12_4_ = 0xddccb9a2;
            auVar127 = vcmpps_avx(auVar52,auVar118,2);
            auVar137._8_4_ = 0x5dccb9a2;
            auVar137._0_8_ = 0x5dccb9a25dccb9a2;
            auVar137._12_4_ = 0x5dccb9a2;
            auVar51 = vcmpps_avx(auVar52,auVar137,5);
            auVar127 = vorps_avx(auVar127,auVar51);
            if ((((auVar127 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar127 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar127 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar127[0xf]) {
              pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.normals.items;
              pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.tangents.items;
              pBVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.dnormals.items;
              local_2d4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                          super_CurveGeometry.maxRadiusScale;
              pauVar50 = (undefined1 (*) [16])(pcVar4 + sVar47 * uVar39);
              _fStack_2b0 = bezier_basis0._484_8_;
              local_2b8 = (undefined1  [8])bezier_basis0._476_8_;
              auVar127 = _local_2b8;
              _fStack_2a8 = bezier_basis0._492_8_;
              uVar18 = _fStack_2a8;
              _fStack_2a0 = bezier_basis0._500_8_;
              uVar19 = _fStack_2a0;
              _fStack_1f0 = bezier_basis0._1640_8_;
              local_1f8 = (undefined1  [8])bezier_basis0._1632_8_;
              auVar51 = _local_1f8;
              _fStack_1e8 = bezier_basis0._1648_8_;
              uVar22 = _fStack_1e8;
              _fStack_1e0 = bezier_basis0._1656_8_;
              uVar23 = _fStack_1e0;
              local_218 = (float)bezier_basis0._2788_8_;
              fStack_214 = SUB84(bezier_basis0._2788_8_,4);
              fStack_210 = (float)bezier_basis0._2796_8_;
              fStack_20c = SUB84(bezier_basis0._2796_8_,4);
              _fStack_208 = bezier_basis0._2804_8_;
              uVar20 = _fStack_208;
              _fStack_200 = bezier_basis0._2812_8_;
              uVar21 = _fStack_200;
              local_178 = (float)bezier_basis0._3944_8_;
              fStack_174 = SUB84(bezier_basis0._3944_8_,4);
              fStack_170 = (float)bezier_basis0._3952_8_;
              fStack_16c = SUB84(bezier_basis0._3952_8_,4);
              _fStack_168 = bezier_basis0._3960_8_;
              uVar32 = _fStack_168;
              _fStack_160 = bezier_basis0._3968_8_;
              uVar33 = _fStack_160;
              _local_1b8 = bezier_basis0._5100_8_;
              uVar24 = _local_1b8;
              _fStack_1b0 = bezier_basis0._5108_8_;
              uVar25 = _fStack_1b0;
              _fStack_1a8 = bezier_basis0._5116_8_;
              uVar26 = _fStack_1a8;
              _fStack_1a0 = bezier_basis0._5124_8_;
              uVar27 = _fStack_1a0;
              _local_198 = bezier_basis0._6256_8_;
              uVar28 = _local_198;
              _fStack_190 = bezier_basis0._6264_8_;
              uVar29 = _fStack_190;
              _fStack_188 = bezier_basis0._6272_8_;
              uVar30 = _fStack_188;
              _fStack_180 = bezier_basis0._6280_8_;
              uVar31 = _fStack_180;
              _local_b8 = bezier_basis0._7412_8_;
              uVar34 = _local_b8;
              _fStack_b0 = bezier_basis0._7420_8_;
              uVar35 = _fStack_b0;
              _fStack_a8 = bezier_basis0._7428_8_;
              uVar36 = _fStack_a8;
              _fStack_a0 = bezier_basis0._7436_8_;
              uVar37 = _fStack_a0;
              local_d8 = (float)bezier_basis0._8568_8_;
              fStack_d4 = SUB84(bezier_basis0._8568_8_,4);
              fStack_d0 = (float)bezier_basis0._8576_8_;
              fStack_cc = SUB84(bezier_basis0._8576_8_,4);
              fStack_c8 = (float)bezier_basis0._8584_8_;
              fStack_c4 = SUB84(bezier_basis0._8584_8_,4);
              fStack_c0 = (float)bezier_basis0._8592_8_;
              fStack_bc = SUB84(bezier_basis0._8592_8_,4);
              do {
                auVar67 = *pauVar50;
                auVar53 = vcmpps_avx(auVar67,auVar118,2);
                auVar54 = vcmpps_avx(auVar67,auVar137,5);
                auVar53 = vorps_avx(auVar53,auVar54);
                _local_2b8 = auVar127;
                _fStack_2a8 = uVar18;
                _fStack_2a0 = uVar19;
                _fStack_208 = uVar20;
                _fStack_200 = uVar21;
                _local_1f8 = auVar51;
                _fStack_1e8 = uVar22;
                _fStack_1e0 = uVar23;
                _local_1b8 = uVar24;
                _fStack_1b0 = uVar25;
                _fStack_1a8 = uVar26;
                _fStack_1a0 = uVar27;
                _local_198 = uVar28;
                _fStack_190 = uVar29;
                _fStack_188 = uVar30;
                _fStack_180 = uVar31;
                _fStack_168 = uVar32;
                _fStack_160 = uVar33;
                _local_b8 = uVar34;
                _fStack_b0 = uVar35;
                _fStack_a8 = uVar36;
                _fStack_a0 = uVar37;
                if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar53[0xf] < '\0') break;
                lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar45);
                lVar9 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar45);
                auVar53 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
                auVar54 = vcmpps_avx(auVar53,auVar118,2);
                auVar55 = vcmpps_avx(auVar53,auVar137,5);
                auVar54 = vorps_avx(auVar54,auVar55);
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') break;
                auVar54 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar39);
                auVar55 = vcmpps_avx(auVar54,auVar118,2);
                auVar56 = vcmpps_avx(auVar54,auVar137,5);
                auVar55 = vorps_avx(auVar55,auVar56);
                if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar55[0xf] < '\0') break;
                lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar45);
                lVar9 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar45);
                auVar55 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
                auVar56 = vcmpps_avx(auVar55,auVar118,6);
                auVar57 = vcmpps_avx(auVar55,auVar137,1);
                auVar56 = vandps_avx(auVar56,auVar57);
                uVar41 = vmovmskps_avx(auVar56);
                if ((~(byte)uVar41 & 7) != 0) break;
                auVar56 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar39);
                auVar57 = vcmpps_avx(auVar56,auVar118,6);
                auVar59 = vcmpps_avx(auVar56,auVar137,1);
                auVar57 = vandps_avx(auVar57,auVar59);
                uVar41 = vmovmskps_avx(auVar57);
                if ((~(byte)uVar41 & 7) != 0) break;
                lVar8 = *(long *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar45);
                lVar9 = *(long *)((long)&(pBVar7->super_RawBufferView).stride + lVar45);
                auVar57 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
                auVar59 = vcmpps_avx(auVar57,auVar118,6);
                auVar60 = vcmpps_avx(auVar57,auVar137,1);
                auVar59 = vandps_avx(auVar59,auVar60);
                uVar41 = vmovmskps_avx(auVar59);
                if ((~(byte)uVar41 & 7) != 0) break;
                auVar59 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar39);
                auVar118 = vcmpps_avx(auVar59,auVar118,6);
                auVar137 = vcmpps_avx(auVar59,auVar137,1);
                auVar118 = vandps_avx(auVar118,auVar137);
                uVar41 = vmovmskps_avx(auVar118);
                if ((~(byte)uVar41 & 7) != 0) break;
                auVar118 = vshufps_avx(auVar52,auVar52,0xff);
                auVar52 = vinsertps_avx(auVar52,ZEXT416((uint)(auVar118._0_4_ * local_2d4)),0x30);
                auVar118 = vshufps_avx(auVar67,auVar67,0xff);
                auVar67 = vinsertps_avx(auVar67,ZEXT416((uint)(auVar118._0_4_ * local_2d4)),0x30);
                auVar118 = vshufps_avx(auVar53,auVar53,0xff);
                auVar118 = vinsertps_avx(auVar53,ZEXT416((uint)(auVar118._0_4_ * local_2d4)),0x30);
                auVar137 = vshufps_avx(auVar54,auVar54,0xff);
                auVar137 = vinsertps_avx(auVar54,ZEXT416((uint)(auVar137._0_4_ * local_2d4)),0x30);
                fVar125 = auVar52._0_4_;
                fVar103 = fVar125 + auVar118._0_4_ * 0.33333334;
                fVar130 = auVar52._4_4_;
                fVar111 = fVar130 + auVar118._4_4_ * 0.33333334;
                fVar133 = auVar52._8_4_;
                fVar112 = fVar133 + auVar118._8_4_ * 0.33333334;
                fVar136 = auVar52._12_4_;
                fVar113 = fVar136 + auVar118._12_4_ * 0.33333334;
                auVar114._0_4_ = auVar137._0_4_ * 0.33333334;
                auVar114._4_4_ = auVar137._4_4_ * 0.33333334;
                auVar114._8_4_ = auVar137._8_4_ * 0.33333334;
                auVar114._12_4_ = auVar137._12_4_ * 0.33333334;
                auVar52 = vsubps_avx(auVar67,auVar114);
                fVar123 = auVar55._0_4_;
                fVar116 = fVar123 + auVar57._0_4_ * 0.33333334;
                fVar126 = auVar55._4_4_;
                fVar120 = fVar126 + auVar57._4_4_ * 0.33333334;
                fVar131 = auVar55._8_4_;
                fVar121 = fVar131 + auVar57._8_4_ * 0.33333334;
                fVar134 = auVar55._12_4_;
                fVar122 = fVar134 + auVar57._12_4_ * 0.33333334;
                auVar53._0_4_ = auVar59._0_4_ * 0.33333334;
                auVar53._4_4_ = auVar59._4_4_ * 0.33333334;
                auVar53._8_4_ = auVar59._8_4_ * 0.33333334;
                auVar53._12_4_ = auVar59._12_4_ * 0.33333334;
                auVar118 = vsubps_avx(auVar56,auVar53);
                fVar66 = auVar67._0_4_;
                fVar76 = auVar67._4_4_;
                fVar77 = auVar67._8_4_;
                fVar176 = auVar177._8_4_;
                fVar78 = auVar67._12_4_;
                fVar178 = auVar177._12_4_;
                fVar124 = auVar52._0_4_ * 0.0;
                fVar129 = auVar52._4_4_ * 0.0;
                fVar132 = fVar176 * auVar52._8_4_;
                fVar135 = fVar178 * auVar52._12_4_;
                fVar91 = fVar66 * 0.0 + fVar124;
                fVar100 = fVar76 * 0.0 + fVar129;
                fVar101 = fVar176 * fVar77 + fVar132;
                fVar102 = fVar178 * fVar78 + fVar135;
                fVar162 = fVar103 * 0.0;
                fVar166 = fVar111 * 0.0;
                fVar168 = fVar176 * fVar112;
                fVar170 = fVar178 * fVar113;
                local_308._0_4_ = fVar162 + fVar91 + fVar125;
                local_308._4_4_ = fVar166 + fVar100 + fVar130;
                fStack_300 = fVar168 + fVar101 + fVar133;
                fStack_2fc = fVar170 + fVar102 + fVar136;
                auVar92._0_4_ = fVar103 * 3.0 + fVar91;
                auVar92._4_4_ = fVar111 * 3.0 + fVar100;
                auVar92._8_4_ = fVar112 * 3.0 + fVar101;
                auVar92._12_4_ = fVar113 * 3.0 + fVar102;
                auVar104._0_4_ = fVar125 * 3.0;
                auVar104._4_4_ = fVar130 * 3.0;
                auVar104._8_4_ = fVar133 * 3.0;
                auVar104._12_4_ = fVar136 * 3.0;
                auVar59 = vsubps_avx(auVar92,auVar104);
                fVar144 = auVar56._0_4_;
                fVar150 = auVar56._4_4_;
                fVar151 = auVar56._8_4_;
                fVar152 = auVar56._12_4_;
                fVar103 = auVar118._0_4_ * 0.0;
                fVar111 = auVar118._4_4_ * 0.0;
                fVar112 = auVar118._8_4_ * fVar176;
                fVar113 = auVar118._12_4_ * fVar178;
                fVar91 = fVar144 * 0.0 + fVar103;
                fVar100 = fVar150 * 0.0 + fVar111;
                fVar101 = fVar151 * fVar176 + fVar112;
                fVar102 = fVar152 * fVar178 + fVar113;
                fVar176 = fVar116 * 0.0;
                fVar178 = fVar120 * 0.0;
                fVar179 = fVar121 * 0.0;
                fVar180 = fVar122 * 0.0;
                auVar138._0_4_ = fVar123 + fVar176 + fVar91;
                auVar138._4_4_ = fVar126 + fVar178 + fVar100;
                auVar138._8_4_ = fVar131 + fVar179 + fVar101;
                auVar138._12_4_ = fVar134 + fVar180 + fVar102;
                auVar93._0_4_ = fVar116 * 3.0 + fVar91;
                auVar93._4_4_ = fVar120 * 3.0 + fVar100;
                auVar93._8_4_ = fVar121 * 3.0 + fVar101;
                auVar93._12_4_ = fVar122 * 3.0 + fVar102;
                auVar117._0_4_ = fVar123 * 3.0;
                auVar117._4_4_ = fVar126 * 3.0;
                auVar117._8_4_ = fVar131 * 3.0;
                auVar117._12_4_ = fVar134 * 3.0;
                auVar53 = vsubps_avx(auVar93,auVar117);
                auVar68._0_4_ = fVar125 * 0.0;
                auVar68._4_4_ = fVar130 * 0.0;
                auVar68._8_4_ = fVar133 * 0.0;
                auVar68._12_4_ = fVar136 * 0.0;
                auVar160._0_4_ = auVar68._0_4_ + fVar162 + fVar66 + fVar124;
                auVar160._4_4_ = auVar68._4_4_ + fVar166 + fVar76 + fVar129;
                auVar160._8_4_ = auVar68._8_4_ + fVar168 + fVar77 + fVar132;
                auVar160._12_4_ = auVar68._12_4_ + fVar170 + fVar78 + fVar135;
                auVar79._0_4_ = fVar66 * 3.0;
                auVar79._4_4_ = fVar76 * 3.0;
                auVar79._8_4_ = fVar77 * 3.0;
                auVar79._12_4_ = fVar78 * 3.0;
                auVar94._0_4_ = auVar52._0_4_ * 3.0;
                auVar94._4_4_ = auVar52._4_4_ * 3.0;
                auVar94._8_4_ = auVar52._8_4_ * 3.0;
                auVar94._12_4_ = auVar52._12_4_ * 3.0;
                auVar52 = vsubps_avx(auVar79,auVar94);
                auVar80._0_4_ = fVar162 + auVar52._0_4_;
                auVar80._4_4_ = fVar166 + auVar52._4_4_;
                auVar80._8_4_ = fVar168 + auVar52._8_4_;
                auVar80._12_4_ = fVar170 + auVar52._12_4_;
                auVar60 = vsubps_avx(auVar80,auVar68);
                auVar81._0_4_ = fVar123 * 0.0;
                auVar81._4_4_ = fVar126 * 0.0;
                auVar81._8_4_ = fVar131 * 0.0;
                auVar81._12_4_ = fVar134 * 0.0;
                auVar69._0_4_ = auVar81._0_4_ + fVar176 + fVar144 + fVar103;
                auVar69._4_4_ = auVar81._4_4_ + fVar178 + fVar150 + fVar111;
                auVar69._8_4_ = auVar81._8_4_ + fVar179 + fVar151 + fVar112;
                auVar69._12_4_ = auVar81._12_4_ + fVar180 + fVar152 + fVar113;
                auVar95._0_4_ = fVar144 * 3.0;
                auVar95._4_4_ = fVar150 * 3.0;
                auVar95._8_4_ = fVar151 * 3.0;
                auVar95._12_4_ = fVar152 * 3.0;
                auVar54._0_4_ = auVar118._0_4_ * 3.0;
                auVar54._4_4_ = auVar118._4_4_ * 3.0;
                auVar54._8_4_ = auVar118._8_4_ * 3.0;
                auVar54._12_4_ = auVar118._12_4_ * 3.0;
                auVar52 = vsubps_avx(auVar95,auVar54);
                auVar55._0_4_ = fVar176 + auVar52._0_4_;
                auVar55._4_4_ = fVar178 + auVar52._4_4_;
                auVar55._8_4_ = fVar179 + auVar52._8_4_;
                auVar55._12_4_ = fVar180 + auVar52._12_4_;
                auVar118 = vsubps_avx(auVar55,auVar81);
                auVar52 = vshufps_avx(auVar59,auVar59,0xc9);
                auVar67 = vshufps_avx(auVar138,auVar138,0xc9);
                fVar170 = auVar59._0_4_;
                auVar96._0_4_ = fVar170 * auVar67._0_4_;
                fVar150 = auVar59._4_4_;
                auVar96._4_4_ = fVar150 * auVar67._4_4_;
                fVar152 = auVar59._8_4_;
                auVar96._8_4_ = fVar152 * auVar67._8_4_;
                fVar178 = auVar59._12_4_;
                auVar96._12_4_ = fVar178 * auVar67._12_4_;
                auVar105._0_4_ = auVar138._0_4_ * auVar52._0_4_;
                auVar105._4_4_ = auVar138._4_4_ * auVar52._4_4_;
                auVar105._8_4_ = auVar138._8_4_ * auVar52._8_4_;
                auVar105._12_4_ = auVar138._12_4_ * auVar52._12_4_;
                auVar67 = vsubps_avx(auVar105,auVar96);
                auVar137 = vshufps_avx(auVar67,auVar67,0xc9);
                auVar67 = vshufps_avx(auVar53,auVar53,0xc9);
                auVar106._0_4_ = fVar170 * auVar67._0_4_;
                auVar106._4_4_ = fVar150 * auVar67._4_4_;
                auVar106._8_4_ = fVar152 * auVar67._8_4_;
                auVar106._12_4_ = fVar178 * auVar67._12_4_;
                auVar56._0_4_ = auVar53._0_4_ * auVar52._0_4_;
                auVar56._4_4_ = auVar53._4_4_ * auVar52._4_4_;
                auVar56._8_4_ = auVar53._8_4_ * auVar52._8_4_;
                auVar56._12_4_ = auVar53._12_4_ * auVar52._12_4_;
                auVar52 = vsubps_avx(auVar56,auVar106);
                auVar53 = vshufps_avx(auVar52,auVar52,0xc9);
                auVar52 = vshufps_avx(auVar60,auVar60,0xc9);
                auVar67 = vshufps_avx(auVar69,auVar69,0xc9);
                fVar163 = auVar60._0_4_;
                auVar57._0_4_ = fVar163 * auVar67._0_4_;
                fVar167 = auVar60._4_4_;
                auVar57._4_4_ = fVar167 * auVar67._4_4_;
                fVar169 = auVar60._8_4_;
                auVar57._8_4_ = fVar169 * auVar67._8_4_;
                fVar171 = auVar60._12_4_;
                auVar57._12_4_ = fVar171 * auVar67._12_4_;
                auVar70._0_4_ = auVar69._0_4_ * auVar52._0_4_;
                auVar70._4_4_ = auVar69._4_4_ * auVar52._4_4_;
                auVar70._8_4_ = auVar69._8_4_ * auVar52._8_4_;
                auVar70._12_4_ = auVar69._12_4_ * auVar52._12_4_;
                auVar67 = vsubps_avx(auVar70,auVar57);
                auVar54 = vshufps_avx(auVar67,auVar67,0xc9);
                auVar67 = vshufps_avx(auVar118,auVar118,0xc9);
                auVar71._0_4_ = fVar163 * auVar67._0_4_;
                auVar71._4_4_ = fVar167 * auVar67._4_4_;
                auVar71._8_4_ = fVar169 * auVar67._8_4_;
                auVar71._12_4_ = fVar171 * auVar67._12_4_;
                auVar82._0_4_ = auVar118._0_4_ * auVar52._0_4_;
                auVar82._4_4_ = auVar118._4_4_ * auVar52._4_4_;
                auVar82._8_4_ = auVar118._8_4_ * auVar52._8_4_;
                auVar82._12_4_ = auVar118._12_4_ * auVar52._12_4_;
                auVar52 = vsubps_avx(auVar82,auVar71);
                auVar55 = vshufps_avx(auVar52,auVar52,0xc9);
                auVar67 = vdpps_avx(auVar137,auVar137,0x7f);
                auVar52 = vblendps_avx(auVar67,_DAT_01feba10,0xe);
                auVar118 = vrsqrtss_avx(auVar52,auVar52);
                fVar66 = auVar118._0_4_;
                auVar118 = vdpps_avx(auVar137,auVar53,0x7f);
                auVar56 = ZEXT416((uint)(fVar66 * 1.5 -
                                        auVar67._0_4_ * 0.5 * fVar66 * fVar66 * fVar66));
                auVar56 = vshufps_avx(auVar56,auVar56,0);
                fVar66 = auVar56._0_4_ * auVar137._0_4_;
                fVar76 = auVar56._4_4_ * auVar137._4_4_;
                fVar77 = auVar56._8_4_ * auVar137._8_4_;
                fVar78 = auVar56._12_4_ * auVar137._12_4_;
                auVar57 = vshufps_avx(auVar67,auVar67,0);
                auVar107._0_4_ = auVar57._0_4_ * auVar53._0_4_;
                auVar107._4_4_ = auVar57._4_4_ * auVar53._4_4_;
                auVar107._8_4_ = auVar57._8_4_ * auVar53._8_4_;
                auVar107._12_4_ = auVar57._12_4_ * auVar53._12_4_;
                auVar118 = vshufps_avx(auVar118,auVar118,0);
                auVar97._0_4_ = auVar118._0_4_ * auVar137._0_4_;
                auVar97._4_4_ = auVar118._4_4_ * auVar137._4_4_;
                auVar97._8_4_ = auVar118._8_4_ * auVar137._8_4_;
                auVar97._12_4_ = auVar118._12_4_ * auVar137._12_4_;
                auVar68 = vsubps_avx(auVar107,auVar97);
                auVar52 = vrcpss_avx(auVar52,auVar52);
                auVar52 = ZEXT416((uint)(auVar52._0_4_ * (2.0 - auVar67._0_4_ * auVar52._0_4_)));
                auVar137 = vshufps_avx(auVar52,auVar52,0);
                auVar67 = vdpps_avx(auVar54,auVar54,0x7f);
                auVar52 = vblendps_avx(auVar67,_DAT_01feba10,0xe);
                auVar118 = vrsqrtss_avx(auVar52,auVar52);
                fVar125 = auVar118._0_4_;
                auVar118 = ZEXT416((uint)(fVar125 * 1.5 -
                                         auVar67._0_4_ * 0.5 * fVar125 * fVar125 * fVar125));
                auVar53 = vshufps_avx(auVar118,auVar118,0);
                fVar125 = auVar54._0_4_ * auVar53._0_4_;
                fVar130 = auVar54._4_4_ * auVar53._4_4_;
                fVar133 = auVar54._8_4_ * auVar53._8_4_;
                fVar136 = auVar54._12_4_ * auVar53._12_4_;
                auVar118 = vdpps_avx(auVar54,auVar55,0x7f);
                auVar57 = vshufps_avx(auVar67,auVar67,0);
                auVar83._0_4_ = auVar57._0_4_ * auVar55._0_4_;
                auVar83._4_4_ = auVar57._4_4_ * auVar55._4_4_;
                auVar83._8_4_ = auVar57._8_4_ * auVar55._8_4_;
                auVar83._12_4_ = auVar57._12_4_ * auVar55._12_4_;
                auVar118 = vshufps_avx(auVar118,auVar118,0);
                auVar58._0_4_ = auVar118._0_4_ * auVar54._0_4_;
                auVar58._4_4_ = auVar118._4_4_ * auVar54._4_4_;
                auVar58._8_4_ = auVar118._8_4_ * auVar54._8_4_;
                auVar58._12_4_ = auVar118._12_4_ * auVar54._12_4_;
                auVar54 = vsubps_avx(auVar83,auVar58);
                auVar52 = vrcpss_avx(auVar52,auVar52);
                auVar52 = ZEXT416((uint)(auVar52._0_4_ * (2.0 - auVar67._0_4_ * auVar52._0_4_)));
                auVar52 = vshufps_avx(auVar52,auVar52,0);
                auVar67 = vshufps_avx(_local_308,_local_308,0xff);
                auVar108._0_4_ = auVar67._0_4_ * fVar66;
                auVar108._4_4_ = auVar67._4_4_ * fVar76;
                auVar108._8_4_ = auVar67._8_4_ * fVar77;
                auVar108._12_4_ = auVar67._12_4_ * fVar78;
                auVar55 = vsubps_avx(_local_308,auVar108);
                auVar118 = vshufps_avx(auVar59,auVar59,0xff);
                auVar72._0_4_ =
                     auVar118._0_4_ * fVar66 +
                     auVar67._0_4_ * auVar56._0_4_ * auVar137._0_4_ * auVar68._0_4_;
                auVar72._4_4_ =
                     auVar118._4_4_ * fVar76 +
                     auVar67._4_4_ * auVar56._4_4_ * auVar137._4_4_ * auVar68._4_4_;
                auVar72._8_4_ =
                     auVar118._8_4_ * fVar77 +
                     auVar67._8_4_ * auVar56._8_4_ * auVar137._8_4_ * auVar68._8_4_;
                auVar72._12_4_ =
                     auVar118._12_4_ * fVar78 +
                     auVar67._12_4_ * auVar56._12_4_ * auVar137._12_4_ * auVar68._12_4_;
                auVar137 = vsubps_avx(auVar59,auVar72);
                local_308._0_4_ = (float)local_308._0_4_ + auVar108._0_4_;
                local_308._4_4_ = (float)local_308._4_4_ + auVar108._4_4_;
                fStack_300 = fStack_300 + auVar108._8_4_;
                fStack_2fc = fStack_2fc + auVar108._12_4_;
                auVar67 = vshufps_avx(auVar160,auVar160,0xff);
                auVar109._0_4_ = auVar67._0_4_ * fVar125;
                auVar109._4_4_ = auVar67._4_4_ * fVar130;
                auVar109._8_4_ = auVar67._8_4_ * fVar133;
                auVar109._12_4_ = auVar67._12_4_ * fVar136;
                auVar56 = vsubps_avx(auVar160,auVar109);
                auVar118 = vshufps_avx(auVar60,auVar60,0xff);
                auVar59._0_4_ =
                     auVar118._0_4_ * fVar125 +
                     auVar67._0_4_ * auVar53._0_4_ * auVar54._0_4_ * auVar52._0_4_;
                auVar59._4_4_ =
                     auVar118._4_4_ * fVar130 +
                     auVar67._4_4_ * auVar53._4_4_ * auVar54._4_4_ * auVar52._4_4_;
                auVar59._8_4_ =
                     auVar118._8_4_ * fVar133 +
                     auVar67._8_4_ * auVar53._8_4_ * auVar54._8_4_ * auVar52._8_4_;
                auVar59._12_4_ =
                     auVar118._12_4_ * fVar136 +
                     auVar67._12_4_ * auVar53._12_4_ * auVar54._12_4_ * auVar52._12_4_;
                auVar52 = vsubps_avx(auVar60,auVar59);
                local_2f8._4_4_ = auVar160._4_4_ + auVar109._4_4_;
                local_2f8._0_4_ = auVar160._0_4_ + auVar109._0_4_;
                fStack_2f0 = auVar160._8_4_ + auVar109._8_4_;
                fStack_2ec = auVar160._12_4_ + auVar109._12_4_;
                auVar60._0_4_ = auVar55._0_4_ + auVar137._0_4_ * 0.33333334;
                auVar60._4_4_ = auVar55._4_4_ + auVar137._4_4_ * 0.33333334;
                auVar60._8_4_ = auVar55._8_4_ + auVar137._8_4_ * 0.33333334;
                auVar60._12_4_ = auVar55._12_4_ + auVar137._12_4_ * 0.33333334;
                auVar84._0_4_ = auVar52._0_4_ * 0.33333334;
                auVar84._4_4_ = auVar52._4_4_ * 0.33333334;
                auVar84._8_4_ = auVar52._8_4_ * 0.33333334;
                auVar84._12_4_ = auVar52._12_4_ * 0.33333334;
                auVar118 = vsubps_avx(auVar56,auVar84);
                auVar52 = vshufps_avx(auVar118,auVar118,0);
                auVar67 = vshufps_avx(auVar118,auVar118,0x55);
                auVar118 = vshufps_avx(auVar118,auVar118,0xaa);
                auVar137 = vshufps_avx(auVar56,auVar56,0);
                auVar53 = vshufps_avx(auVar56,auVar56,0x55);
                auVar54 = vshufps_avx(auVar56,auVar56,0xaa);
                fStack_168 = (float)bezier_basis0._3960_8_;
                fStack_164 = SUB84(bezier_basis0._3960_8_,4);
                fStack_160 = (float)bezier_basis0._3968_8_;
                fVar120 = auVar137._0_4_;
                fVar121 = auVar137._4_4_;
                fVar122 = auVar137._8_4_;
                fVar124 = auVar137._12_4_;
                fVar91 = auVar53._0_4_;
                fVar100 = auVar53._4_4_;
                fVar101 = auVar53._8_4_;
                fVar102 = auVar53._12_4_;
                fVar111 = auVar54._0_4_;
                fVar112 = auVar54._4_4_;
                fVar113 = auVar54._8_4_;
                fVar116 = auVar54._12_4_;
                fStack_208 = (float)bezier_basis0._2804_8_;
                fStack_204 = SUB84(bezier_basis0._2804_8_,4);
                fStack_200 = (float)bezier_basis0._2812_8_;
                fVar126 = auVar52._0_4_;
                fVar134 = auVar52._4_4_;
                fVar166 = auVar52._8_4_;
                fVar179 = auVar67._0_4_;
                fVar155 = auVar67._4_4_;
                fVar157 = auVar67._8_4_;
                fVar159 = auVar67._12_4_;
                fVar144 = auVar118._0_4_;
                fVar151 = auVar118._4_4_;
                fVar176 = auVar118._8_4_;
                auVar67 = vshufps_avx(auVar60,auVar60,0);
                local_1f8._0_4_ = (undefined4)bezier_basis0._1632_8_;
                local_1f8._4_4_ = SUB84(bezier_basis0._1632_8_,4);
                fStack_1f0 = (float)bezier_basis0._1640_8_;
                fStack_1ec = SUB84(bezier_basis0._1640_8_,4);
                fStack_1e8 = (float)bezier_basis0._1648_8_;
                fStack_1e4 = SUB84(bezier_basis0._1648_8_,4);
                fStack_1e0 = (float)bezier_basis0._1656_8_;
                fVar129 = auVar67._0_4_;
                fVar132 = auVar67._4_4_;
                fVar135 = auVar67._8_4_;
                fVar123 = auVar67._12_4_;
                auVar67 = vshufps_avx(auVar60,auVar60,0x55);
                fVar180 = auVar67._0_4_;
                fVar156 = auVar67._4_4_;
                fVar158 = auVar67._8_4_;
                auVar137 = vshufps_avx(auVar60,auVar60,0xaa);
                fVar125 = auVar137._0_4_;
                fVar130 = auVar137._4_4_;
                fVar133 = auVar137._8_4_;
                fVar136 = auVar137._12_4_;
                auVar137 = vshufps_avx(auVar55,auVar55,0);
                local_2b8._0_4_ = (undefined4)bezier_basis0._476_8_;
                local_2b8._4_4_ = SUB84(bezier_basis0._476_8_,4);
                fStack_2b0 = (float)bezier_basis0._484_8_;
                fStack_2ac = SUB84(bezier_basis0._484_8_,4);
                fStack_2a8 = (float)bezier_basis0._492_8_;
                fStack_2a4 = SUB84(bezier_basis0._492_8_,4);
                fStack_2a0 = (float)bezier_basis0._500_8_;
                fVar66 = auVar137._0_4_;
                fVar76 = auVar137._4_4_;
                fVar77 = auVar137._8_4_;
                fVar78 = auVar137._12_4_;
                auVar164._0_4_ =
                     (float)local_2b8._0_4_ * fVar66 +
                     fVar129 * (float)local_1f8._0_4_ + fVar126 * local_218 + fVar120 * local_178;
                auVar164._4_4_ =
                     (float)local_2b8._4_4_ * fVar76 +
                     fVar132 * (float)local_1f8._4_4_ + fVar134 * fStack_214 + fVar121 * fStack_174;
                auVar164._8_4_ =
                     fStack_2b0 * fVar77 +
                     fVar135 * fStack_1f0 + fVar166 * fStack_210 + fVar122 * fStack_170;
                auVar164._12_4_ =
                     fStack_2ac * fVar78 +
                     fVar123 * fStack_1ec + auVar52._12_4_ * fStack_20c + fVar124 * fStack_16c;
                auVar164._16_4_ =
                     fStack_2a8 * fVar66 +
                     fVar129 * fStack_1e8 + fVar126 * fStack_208 + fVar120 * fStack_168;
                auVar164._20_4_ =
                     fStack_2a4 * fVar76 +
                     fVar132 * fStack_1e4 + fVar134 * fStack_204 + fVar121 * fStack_164;
                auVar164._24_4_ =
                     fStack_2a0 * fVar77 +
                     fVar135 * fStack_1e0 + fVar166 * fStack_200 + fVar122 * fStack_160;
                auVar164._28_4_ = fVar159 + 0.0 + 0.0;
                auVar137 = vshufps_avx(auVar55,auVar55,0x55);
                fVar131 = auVar137._0_4_;
                fVar162 = auVar137._4_4_;
                fVar168 = auVar137._8_4_;
                auVar161._0_4_ =
                     fVar180 * (float)local_1f8._0_4_ + fVar179 * local_218 + fVar91 * local_178 +
                     fVar131 * (float)local_2b8._0_4_;
                auVar161._4_4_ =
                     fVar156 * (float)local_1f8._4_4_ + fVar155 * fStack_214 + fVar100 * fStack_174
                     + fVar162 * (float)local_2b8._4_4_;
                auVar161._8_4_ =
                     fVar158 * fStack_1f0 + fVar157 * fStack_210 + fVar101 * fStack_170 +
                     fVar168 * fStack_2b0;
                auVar161._12_4_ =
                     auVar67._12_4_ * fStack_1ec + fVar159 * fStack_20c + fVar102 * fStack_16c +
                     auVar137._12_4_ * fStack_2ac;
                auVar161._16_4_ =
                     fVar180 * fStack_1e8 + fVar179 * fStack_208 + fVar91 * fStack_168 +
                     fVar131 * fStack_2a8;
                auVar161._20_4_ =
                     fVar156 * fStack_1e4 + fVar155 * fStack_204 + fVar100 * fStack_164 +
                     fVar162 * fStack_2a4;
                auVar161._24_4_ =
                     fVar158 * fStack_1e0 + fVar157 * fStack_200 + fVar101 * fStack_160 +
                     fVar168 * fStack_2a0;
                auVar161._28_4_ = fVar159 + 0.0 + 0.0;
                auVar53 = vshufps_avx(auVar55,auVar55,0xaa);
                fVar172 = auVar53._0_4_;
                fVar174 = auVar53._4_4_;
                fVar175 = auVar53._8_4_;
                auVar73._0_4_ =
                     fVar111 * local_178 + fVar144 * local_218 + fVar125 * (float)local_1f8._0_4_ +
                     fVar172 * (float)local_2b8._0_4_;
                auVar73._4_4_ =
                     fVar112 * fStack_174 + fVar151 * fStack_214 + fVar130 * (float)local_1f8._4_4_
                     + fVar174 * (float)local_2b8._4_4_;
                auVar73._8_4_ =
                     fVar113 * fStack_170 + fVar176 * fStack_210 + fVar133 * fStack_1f0 +
                     fVar175 * fStack_2b0;
                auVar73._12_4_ =
                     fVar116 * fStack_16c + auVar118._12_4_ * fStack_20c + fVar136 * fStack_1ec +
                     auVar53._12_4_ * fStack_2ac;
                auVar73._16_4_ =
                     fVar111 * fStack_168 + fVar144 * fStack_208 + fVar125 * fStack_1e8 +
                     fVar172 * fStack_2a8;
                auVar73._20_4_ =
                     fVar112 * fStack_164 + fVar151 * fStack_204 + fVar130 * fStack_1e4 +
                     fVar174 * fStack_2a4;
                auVar73._24_4_ =
                     fVar113 * fStack_160 + fVar176 * fStack_200 + fVar133 * fStack_1e0 +
                     fVar175 * fStack_2a0;
                auVar73._28_4_ = 0;
                local_b8 = (float)bezier_basis0._7412_8_;
                fStack_b4 = SUB84(bezier_basis0._7412_8_,4);
                fStack_b0 = (float)bezier_basis0._7420_8_;
                fStack_ac = SUB84(bezier_basis0._7420_8_,4);
                fStack_a8 = (float)bezier_basis0._7428_8_;
                fStack_a4 = SUB84(bezier_basis0._7428_8_,4);
                fStack_a0 = (float)bezier_basis0._7436_8_;
                local_198 = (float)bezier_basis0._6256_8_;
                fStack_194 = SUB84(bezier_basis0._6256_8_,4);
                fStack_190 = (float)bezier_basis0._6264_8_;
                fStack_18c = SUB84(bezier_basis0._6264_8_,4);
                fStack_188 = (float)bezier_basis0._6272_8_;
                fStack_184 = SUB84(bezier_basis0._6272_8_,4);
                fStack_180 = (float)bezier_basis0._6280_8_;
                fStack_17c = SUB84(bezier_basis0._6280_8_,4);
                fVar103 = fVar123 + fStack_bc + fVar102;
                local_1b8 = (float)bezier_basis0._5100_8_;
                fStack_1b4 = SUB84(bezier_basis0._5100_8_,4);
                fStack_1b0 = (float)bezier_basis0._5108_8_;
                fStack_1ac = SUB84(bezier_basis0._5108_8_,4);
                fStack_1a8 = (float)bezier_basis0._5116_8_;
                fStack_1a4 = SUB84(bezier_basis0._5116_8_,4);
                fStack_1a0 = (float)bezier_basis0._5124_8_;
                auVar87._0_4_ =
                     fVar66 * local_1b8 +
                     fVar129 * local_198 + local_b8 * fVar126 + local_d8 * fVar120;
                auVar87._4_4_ =
                     fVar76 * fStack_1b4 +
                     fVar132 * fStack_194 + fStack_b4 * fVar134 + fStack_d4 * fVar121;
                auVar87._8_4_ =
                     fVar77 * fStack_1b0 +
                     fVar135 * fStack_190 + fStack_b0 * fVar166 + fStack_d0 * fVar122;
                auVar87._12_4_ =
                     fVar78 * fStack_1ac +
                     fVar123 * fStack_18c + fStack_ac * auVar52._12_4_ + fStack_cc * fVar124;
                auVar87._16_4_ =
                     fVar66 * fStack_1a8 +
                     fVar129 * fStack_188 + fStack_a8 * fVar126 + fStack_c8 * fVar120;
                auVar87._20_4_ =
                     fVar76 * fStack_1a4 +
                     fVar132 * fStack_184 + fStack_a4 * fVar134 + fStack_c4 * fVar121;
                auVar87._24_4_ =
                     fVar77 * fStack_1a0 +
                     fVar135 * fStack_180 + fStack_a0 * fVar166 + fStack_c0 * fVar122;
                auVar87._28_4_ = fVar78 + fVar123 + fStack_bc + fVar124;
                auVar62._0_4_ =
                     fVar131 * local_1b8 +
                     fVar180 * local_198 + local_b8 * fVar179 + local_d8 * fVar91;
                auVar62._4_4_ =
                     fVar162 * fStack_1b4 +
                     fVar156 * fStack_194 + fStack_b4 * fVar155 + fStack_d4 * fVar100;
                auVar62._8_4_ =
                     fVar168 * fStack_1b0 +
                     fVar158 * fStack_190 + fStack_b0 * fVar157 + fStack_d0 * fVar101;
                auVar62._12_4_ =
                     auVar137._12_4_ * fStack_1ac +
                     auVar67._12_4_ * fStack_18c + fStack_ac * fVar159 + fStack_cc * fVar102;
                auVar62._16_4_ =
                     fVar131 * fStack_1a8 +
                     fVar180 * fStack_188 + fStack_a8 * fVar179 + fStack_c8 * fVar91;
                auVar62._20_4_ =
                     fVar162 * fStack_1a4 +
                     fVar156 * fStack_184 + fStack_a4 * fVar155 + fStack_c4 * fVar100;
                auVar62._24_4_ =
                     fVar168 * fStack_1a0 +
                     fVar158 * fStack_180 + fStack_a0 * fVar157 + fStack_c0 * fVar101;
                auVar62._28_4_ = fStack_17c + fVar103;
                auVar98._0_4_ =
                     fVar172 * local_1b8 +
                     fVar125 * local_198 + fVar144 * local_b8 + local_d8 * fVar111;
                auVar98._4_4_ =
                     fVar174 * fStack_1b4 +
                     fVar130 * fStack_194 + fVar151 * fStack_b4 + fStack_d4 * fVar112;
                auVar98._8_4_ =
                     fVar175 * fStack_1b0 +
                     fVar133 * fStack_190 + fVar176 * fStack_b0 + fStack_d0 * fVar113;
                auVar98._12_4_ =
                     auVar53._12_4_ * fStack_1ac +
                     fVar136 * fStack_18c + auVar118._12_4_ * fStack_ac + fStack_cc * fVar116;
                auVar98._16_4_ =
                     fVar172 * fStack_1a8 +
                     fVar125 * fStack_188 + fVar144 * fStack_a8 + fStack_c8 * fVar111;
                auVar98._20_4_ =
                     fVar174 * fStack_1a4 +
                     fVar130 * fStack_184 + fVar151 * fStack_a4 + fStack_c4 * fVar112;
                auVar98._24_4_ =
                     fVar175 * fStack_1a0 +
                     fVar133 * fStack_180 + fVar176 * fStack_a0 + fStack_c0 * fVar113;
                auVar98._28_4_ = fVar103 + fVar136 + fStack_bc + fVar116;
                auVar139 = ZEXT1232(ZEXT412(0)) << 0x20;
                auVar11 = vblendps_avx(auVar87,auVar139,1);
                auVar139 = vblendps_avx(auVar62,auVar139,1);
                auVar140 = ZEXT1232(ZEXT412(0)) << 0x20;
                auVar141 = vblendps_avx(auVar98,auVar140,1);
                auVar119._4_4_ = auVar11._4_4_ * 0.055555556;
                auVar119._0_4_ = auVar11._0_4_ * 0.055555556;
                auVar119._8_4_ = auVar11._8_4_ * 0.055555556;
                auVar119._12_4_ = auVar11._12_4_ * 0.055555556;
                auVar119._16_4_ = auVar11._16_4_ * 0.055555556;
                auVar119._20_4_ = auVar11._20_4_ * 0.055555556;
                auVar119._24_4_ = auVar11._24_4_ * 0.055555556;
                auVar119._28_4_ = auVar11._28_4_;
                auVar11._4_4_ = auVar139._4_4_ * 0.055555556;
                auVar11._0_4_ = auVar139._0_4_ * 0.055555556;
                auVar11._8_4_ = auVar139._8_4_ * 0.055555556;
                auVar11._12_4_ = auVar139._12_4_ * 0.055555556;
                auVar11._16_4_ = auVar139._16_4_ * 0.055555556;
                auVar11._20_4_ = auVar139._20_4_ * 0.055555556;
                auVar11._24_4_ = auVar139._24_4_ * 0.055555556;
                auVar11._28_4_ = auVar139._28_4_;
                auVar139._4_4_ = auVar141._4_4_ * 0.055555556;
                auVar139._0_4_ = auVar141._0_4_ * 0.055555556;
                auVar139._8_4_ = auVar141._8_4_ * 0.055555556;
                auVar139._12_4_ = auVar141._12_4_ * 0.055555556;
                auVar139._16_4_ = auVar141._16_4_ * 0.055555556;
                auVar139._20_4_ = auVar141._20_4_ * 0.055555556;
                auVar139._24_4_ = auVar141._24_4_ * 0.055555556;
                auVar139._28_4_ = auVar141._28_4_;
                auVar119 = vsubps_avx(auVar164,auVar119);
                auVar154 = vsubps_avx(auVar161,auVar11);
                auVar16 = vsubps_avx(auVar73,auVar139);
                auVar11 = vblendps_avx(auVar87,auVar140,0x80);
                auVar139 = vblendps_avx(auVar62,auVar140,0x80);
                auVar141 = vblendps_avx(auVar98,auVar140,0x80);
                auVar88._0_4_ = auVar164._0_4_ + auVar11._0_4_ * 0.055555556;
                auVar88._4_4_ = auVar164._4_4_ + auVar11._4_4_ * 0.055555556;
                auVar88._8_4_ = auVar164._8_4_ + auVar11._8_4_ * 0.055555556;
                auVar88._12_4_ = auVar164._12_4_ + auVar11._12_4_ * 0.055555556;
                auVar88._16_4_ = auVar164._16_4_ + auVar11._16_4_ * 0.055555556;
                auVar88._20_4_ = auVar164._20_4_ + auVar11._20_4_ * 0.055555556;
                auVar88._24_4_ = auVar164._24_4_ + auVar11._24_4_ * 0.055555556;
                auVar88._28_4_ = auVar164._28_4_ + auVar11._28_4_;
                auVar63._0_4_ = auVar161._0_4_ + auVar139._0_4_ * 0.055555556;
                auVar63._4_4_ = auVar161._4_4_ + auVar139._4_4_ * 0.055555556;
                auVar63._8_4_ = auVar161._8_4_ + auVar139._8_4_ * 0.055555556;
                auVar63._12_4_ = auVar161._12_4_ + auVar139._12_4_ * 0.055555556;
                auVar63._16_4_ = auVar161._16_4_ + auVar139._16_4_ * 0.055555556;
                auVar63._20_4_ = auVar161._20_4_ + auVar139._20_4_ * 0.055555556;
                auVar63._24_4_ = auVar161._24_4_ + auVar139._24_4_ * 0.055555556;
                auVar63._28_4_ = auVar161._28_4_ + auVar139._28_4_;
                auVar99._0_4_ = auVar73._0_4_ + auVar141._0_4_ * 0.055555556;
                auVar99._4_4_ = auVar73._4_4_ + auVar141._4_4_ * 0.055555556;
                auVar99._8_4_ = auVar73._8_4_ + auVar141._8_4_ * 0.055555556;
                auVar99._12_4_ = auVar73._12_4_ + auVar141._12_4_ * 0.055555556;
                auVar99._16_4_ = auVar73._16_4_ + auVar141._16_4_ * 0.055555556;
                auVar99._20_4_ = auVar73._20_4_ + auVar141._20_4_ * 0.055555556;
                auVar99._24_4_ = auVar73._24_4_ + auVar141._24_4_ * 0.055555556;
                auVar99._28_4_ = auVar141._28_4_ + 0.0;
                auVar147._8_4_ = 0x7f800000;
                auVar147._0_8_ = 0x7f8000007f800000;
                auVar147._12_4_ = 0x7f800000;
                auVar147._16_4_ = 0x7f800000;
                auVar147._20_4_ = 0x7f800000;
                auVar147._24_4_ = 0x7f800000;
                auVar147._28_4_ = 0x7f800000;
                auVar11 = vminps_avx(auVar147,auVar164);
                auVar139 = vminps_avx(auVar147,auVar161);
                auVar141 = vminps_avx(auVar119,auVar88);
                auVar140 = vminps_avx(auVar11,auVar141);
                auVar11 = vminps_avx(auVar154,auVar63);
                auVar14 = vminps_avx(auVar139,auVar11);
                auVar11 = vminps_avx(auVar147,auVar73);
                auVar139 = vminps_avx(auVar16,auVar99);
                auVar15 = vminps_avx(auVar11,auVar139);
                auVar173._0_4_ = (fVar170 + auVar72._0_4_) * 0.33333334 + (float)local_308._0_4_;
                auVar173._4_4_ = (fVar150 + auVar72._4_4_) * 0.33333334 + (float)local_308._4_4_;
                auVar173._8_4_ = (fVar152 + auVar72._8_4_) * 0.33333334 + fStack_300;
                auVar173._12_4_ = (fVar178 + auVar72._12_4_) * 0.33333334 + fStack_2fc;
                auVar145._0_4_ = (fVar163 + auVar59._0_4_) * 0.33333334;
                auVar145._4_4_ = (fVar167 + auVar59._4_4_) * 0.33333334;
                auVar145._8_4_ = (fVar169 + auVar59._8_4_) * 0.33333334;
                auVar145._12_4_ = (fVar171 + auVar59._12_4_) * 0.33333334;
                auVar54 = vsubps_avx(_local_2f8,auVar145);
                auVar148._8_4_ = 0xff800000;
                auVar148._0_8_ = 0xff800000ff800000;
                auVar148._12_4_ = 0xff800000;
                auVar148._16_4_ = 0xff800000;
                auVar148._20_4_ = 0xff800000;
                auVar148._24_4_ = 0xff800000;
                auVar148._28_4_ = 0xff800000;
                auVar11 = vmaxps_avx(auVar148,auVar164);
                auVar139 = vmaxps_avx(auVar148,auVar161);
                auVar141 = vmaxps_avx(auVar148,auVar73);
                auVar119 = vmaxps_avx(auVar119,auVar88);
                auVar11 = vmaxps_avx(auVar11,auVar119);
                auVar119 = vmaxps_avx(auVar154,auVar63);
                auVar139 = vmaxps_avx(auVar139,auVar119);
                auVar119 = vmaxps_avx(auVar16,auVar99);
                auVar141 = vmaxps_avx(auVar141,auVar119);
                auVar119 = vshufps_avx(auVar140,auVar140,0xb1);
                auVar119 = vminps_avx(auVar140,auVar119);
                auVar154 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar154);
                auVar52 = vminps_avx(auVar119._0_16_,auVar119._16_16_);
                auVar119 = vshufps_avx(auVar14,auVar14,0xb1);
                auVar119 = vminps_avx(auVar14,auVar119);
                auVar154 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar154);
                auVar67 = vminps_avx(auVar119._0_16_,auVar119._16_16_);
                auVar67 = vunpcklps_avx(auVar52,auVar67);
                auVar119 = vshufps_avx(auVar15,auVar15,0xb1);
                auVar119 = vminps_avx(auVar15,auVar119);
                auVar154 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar154);
                auVar52 = vminps_avx(auVar119._0_16_,auVar119._16_16_);
                local_258 = vinsertps_avx(auVar67,auVar52,0x28);
                auVar119 = vshufps_avx(auVar11,auVar11,0xb1);
                auVar11 = vmaxps_avx(auVar11,auVar119);
                auVar119 = vshufpd_avx(auVar11,auVar11,5);
                auVar11 = vmaxps_avx(auVar11,auVar119);
                auVar52 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
                auVar11 = vshufps_avx(auVar139,auVar139,0xb1);
                auVar11 = vmaxps_avx(auVar139,auVar11);
                auVar139 = vshufpd_avx(auVar11,auVar11,5);
                auVar11 = vmaxps_avx(auVar11,auVar139);
                auVar67 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
                auVar67 = vunpcklps_avx(auVar52,auVar67);
                auVar11 = vshufps_avx(auVar141,auVar141,0xb1);
                auVar11 = vmaxps_avx(auVar141,auVar11);
                auVar139 = vshufpd_avx(auVar11,auVar11,5);
                auVar11 = vmaxps_avx(auVar11,auVar139);
                auVar52 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
                local_248 = vinsertps_avx(auVar67,auVar52,0x28);
                auVar52 = vshufps_avx(auVar173,auVar173,0);
                auVar67 = vshufps_avx(auVar173,auVar173,0x55);
                local_f8._16_16_ = auVar67;
                local_f8._0_16_ = auVar67;
                auVar118 = vshufps_avx(auVar173,auVar173,0xaa);
                local_118._16_16_ = auVar118;
                local_118._0_16_ = auVar118;
                auVar137 = vshufps_avx(auVar54,auVar54,0);
                auVar53 = vshufps_avx(auVar54,auVar54,0x55);
                auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
                auVar55 = vshufps_avx(_local_2f8,_local_2f8,0);
                auVar56 = vshufps_avx(_local_2f8,_local_2f8,0x55);
                auVar57 = vshufps_avx(_local_2f8,_local_2f8,0xaa);
                fVar66 = auVar55._0_4_;
                fVar76 = auVar55._4_4_;
                fVar77 = auVar55._8_4_;
                fVar78 = auVar55._12_4_;
                fVar112 = auVar56._0_4_;
                fVar113 = auVar56._4_4_;
                fVar116 = auVar56._8_4_;
                fVar120 = auVar56._12_4_;
                fVar101 = auVar57._0_4_;
                fVar102 = auVar57._4_4_;
                fVar103 = auVar57._8_4_;
                fVar111 = auVar57._12_4_;
                fVar156 = auVar137._0_4_;
                fVar157 = auVar137._4_4_;
                fVar158 = auVar137._8_4_;
                fVar130 = auVar53._0_4_;
                fVar133 = auVar53._4_4_;
                fVar136 = auVar53._8_4_;
                fVar91 = auVar53._12_4_;
                fVar170 = auVar54._0_4_;
                fVar144 = auVar54._4_4_;
                fVar150 = auVar54._8_4_;
                fVar151 = auVar52._0_4_;
                fVar152 = auVar52._4_4_;
                fVar176 = auVar52._8_4_;
                fVar178 = auVar67._0_4_;
                fVar179 = auVar67._4_4_;
                fVar180 = auVar67._8_4_;
                fVar155 = auVar67._12_4_;
                fVar129 = auVar118._0_4_;
                fVar132 = auVar118._4_4_;
                fVar135 = auVar118._8_4_;
                fVar123 = auVar118._12_4_;
                auVar67 = vshufps_avx(_local_308,_local_308,0);
                fVar121 = auVar67._0_4_;
                fVar122 = auVar67._4_4_;
                fVar124 = auVar67._8_4_;
                auVar149._0_4_ =
                     fVar121 * (float)local_2b8._0_4_ +
                     fVar151 * (float)local_1f8._0_4_ + fVar156 * local_218 + fVar66 * local_178;
                auVar149._4_4_ =
                     fVar122 * (float)local_2b8._4_4_ +
                     fVar152 * (float)local_1f8._4_4_ + fVar157 * fStack_214 + fVar76 * fStack_174;
                auVar149._8_4_ =
                     fVar124 * fStack_2b0 +
                     fVar176 * fStack_1f0 + fVar158 * fStack_210 + fVar77 * fStack_170;
                auVar149._12_4_ =
                     auVar67._12_4_ * fStack_2ac +
                     auVar52._12_4_ * fStack_1ec +
                     auVar137._12_4_ * fStack_20c + fVar78 * fStack_16c;
                auVar149._16_4_ =
                     fVar121 * fStack_2a8 +
                     fVar151 * fStack_1e8 + fVar156 * fStack_208 + fVar66 * fStack_168;
                auVar149._20_4_ =
                     fVar122 * fStack_2a4 +
                     fVar152 * fStack_1e4 + fVar157 * fStack_204 + fVar76 * fStack_164;
                auVar149._24_4_ =
                     fVar124 * fStack_2a0 +
                     fVar176 * fStack_1e0 + fVar158 * fStack_200 + fVar77 * fStack_160;
                auVar149._28_4_ = auVar140._28_4_ + -INFINITY + -INFINITY + 0.0;
                auVar118 = vshufps_avx(_local_308,_local_308,0x55);
                fVar126 = auVar118._0_4_;
                fVar131 = auVar118._4_4_;
                fVar134 = auVar118._8_4_;
                auVar165._0_4_ =
                     fVar126 * (float)local_2b8._0_4_ +
                     fVar178 * (float)local_1f8._0_4_ + fVar130 * local_218 + fVar112 * local_178;
                auVar165._4_4_ =
                     fVar131 * (float)local_2b8._4_4_ +
                     fVar179 * (float)local_1f8._4_4_ + fVar133 * fStack_214 + fVar113 * fStack_174;
                auVar165._8_4_ =
                     fVar134 * fStack_2b0 +
                     fVar180 * fStack_1f0 + fVar136 * fStack_210 + fVar116 * fStack_170;
                auVar165._12_4_ =
                     auVar118._12_4_ * fStack_2ac +
                     fVar155 * fStack_1ec + fVar91 * fStack_20c + fVar120 * fStack_16c;
                auVar165._16_4_ =
                     fVar126 * fStack_2a8 +
                     fVar178 * fStack_1e8 + fVar130 * fStack_208 + fVar112 * fStack_168;
                auVar165._20_4_ =
                     fVar131 * fStack_2a4 +
                     fVar179 * fStack_1e4 + fVar133 * fStack_204 + fVar113 * fStack_164;
                auVar165._24_4_ =
                     fVar134 * fStack_2a0 +
                     fVar180 * fStack_1e0 + fVar136 * fStack_200 + fVar116 * fStack_160;
                auVar165._28_4_ = fVar155 + auVar14._28_4_ + -INFINITY + -INFINITY;
                auVar53 = vshufps_avx(_local_308,_local_308,0xaa);
                fVar162 = auVar53._0_4_;
                fVar166 = auVar53._4_4_;
                fVar168 = auVar53._8_4_;
                auVar143._0_4_ =
                     fVar162 * (float)local_2b8._0_4_ +
                     fVar129 * (float)local_1f8._0_4_ + fVar170 * local_218 + fVar101 * local_178;
                auVar143._4_4_ =
                     fVar166 * (float)local_2b8._4_4_ +
                     fVar132 * (float)local_1f8._4_4_ + fVar144 * fStack_214 + fVar102 * fStack_174;
                auVar143._8_4_ =
                     fVar168 * fStack_2b0 +
                     fVar135 * fStack_1f0 + fVar150 * fStack_210 + fVar103 * fStack_170;
                auVar143._12_4_ =
                     auVar53._12_4_ * fStack_2ac +
                     fVar123 * fStack_1ec + auVar54._12_4_ * fStack_20c + fVar111 * fStack_16c;
                auVar143._16_4_ =
                     fVar162 * fStack_2a8 +
                     fVar129 * fStack_1e8 + fVar170 * fStack_208 + fVar101 * fStack_168;
                auVar143._20_4_ =
                     fVar166 * fStack_2a4 +
                     fVar132 * fStack_1e4 + fVar144 * fStack_204 + fVar102 * fStack_164;
                auVar143._24_4_ =
                     fVar168 * fStack_2a0 +
                     fVar135 * fStack_1e0 + fVar150 * fStack_200 + fVar103 * fStack_160;
                auVar143._28_4_ = auVar15._28_4_ + -INFINITY + -INFINITY + 0.0;
                auVar177 = ZEXT864(0) << 0x20;
                fVar125 = fVar120 + fVar78 + fVar123;
                fVar100 = fVar120 + fVar91 + fVar120;
                auVar64._0_4_ =
                     fVar121 * local_1b8 +
                     fVar151 * local_198 + fVar156 * local_b8 + local_d8 * fVar66;
                auVar64._4_4_ =
                     fVar122 * fStack_1b4 +
                     fVar152 * fStack_194 + fVar157 * fStack_b4 + fStack_d4 * fVar76;
                auVar64._8_4_ =
                     fVar124 * fStack_1b0 +
                     fVar176 * fStack_190 + fVar158 * fStack_b0 + fStack_d0 * fVar77;
                auVar64._12_4_ =
                     auVar67._12_4_ * fStack_1ac +
                     auVar52._12_4_ * fStack_18c + auVar137._12_4_ * fStack_ac + fStack_cc * fVar78;
                auVar64._16_4_ =
                     fVar121 * fStack_1a8 +
                     fVar151 * fStack_188 + fVar156 * fStack_a8 + fStack_c8 * fVar66;
                auVar64._20_4_ =
                     fVar122 * fStack_1a4 +
                     fVar152 * fStack_184 + fVar157 * fStack_a4 + fStack_c4 * fVar76;
                auVar64._24_4_ =
                     fVar124 * fStack_1a0 +
                     fVar176 * fStack_180 + fVar158 * fStack_a0 + fStack_c0 * fVar77;
                auVar64._28_4_ = fStack_17c + fVar125;
                auVar74._0_4_ =
                     fVar126 * local_1b8 +
                     local_198 * fVar178 + fVar130 * local_b8 + local_d8 * fVar112;
                auVar74._4_4_ =
                     fVar131 * fStack_1b4 +
                     fStack_194 * fVar179 + fVar133 * fStack_b4 + fStack_d4 * fVar113;
                auVar74._8_4_ =
                     fVar134 * fStack_1b0 +
                     fStack_190 * fVar180 + fVar136 * fStack_b0 + fStack_d0 * fVar116;
                auVar74._12_4_ =
                     auVar118._12_4_ * fStack_1ac +
                     fStack_18c * fVar155 + fVar91 * fStack_ac + fStack_cc * fVar120;
                auVar74._16_4_ =
                     fVar126 * fStack_1a8 +
                     fStack_188 * fVar178 + fVar130 * fStack_a8 + fStack_c8 * fVar112;
                auVar74._20_4_ =
                     fVar131 * fStack_1a4 +
                     fStack_184 * fVar179 + fVar133 * fStack_a4 + fStack_c4 * fVar113;
                auVar74._24_4_ =
                     fVar134 * fStack_1a0 +
                     fStack_180 * fVar180 + fVar136 * fStack_a0 + fStack_c0 * fVar116;
                auVar74._28_4_ = fVar125 + fVar100;
                auVar89._0_4_ =
                     fVar162 * local_1b8 +
                     local_198 * fVar129 + fVar170 * local_b8 + local_d8 * fVar101;
                auVar89._4_4_ =
                     fVar166 * fStack_1b4 +
                     fStack_194 * fVar132 + fVar144 * fStack_b4 + fStack_d4 * fVar102;
                auVar89._8_4_ =
                     fVar168 * fStack_1b0 +
                     fStack_190 * fVar135 + fVar150 * fStack_b0 + fStack_d0 * fVar103;
                auVar89._12_4_ =
                     auVar53._12_4_ * fStack_1ac +
                     fStack_18c * fVar123 + auVar54._12_4_ * fStack_ac + fStack_cc * fVar111;
                auVar89._16_4_ =
                     fVar162 * fStack_1a8 +
                     fStack_188 * fVar129 + fVar170 * fStack_a8 + fStack_c8 * fVar101;
                auVar89._20_4_ =
                     fVar166 * fStack_1a4 +
                     fStack_184 * fVar132 + fVar144 * fStack_a4 + fStack_c4 * fVar102;
                auVar89._24_4_ =
                     fVar168 * fStack_1a0 +
                     fStack_180 * fVar135 + fVar150 * fStack_a0 + fStack_c0 * fVar103;
                auVar89._28_4_ = fVar100 + fVar120 + fVar111 + fVar120;
                auVar11 = vblendps_avx(auVar64,ZEXT832(0) << 0x20,1);
                auVar139 = vblendps_avx(auVar74,ZEXT832(0) << 0x20,1);
                auVar119 = ZEXT832(0) << 0x20;
                auVar141 = vblendps_avx(auVar89,auVar119,1);
                auVar140._4_4_ = auVar11._4_4_ * 0.055555556;
                auVar140._0_4_ = auVar11._0_4_ * 0.055555556;
                auVar140._8_4_ = auVar11._8_4_ * 0.055555556;
                auVar140._12_4_ = auVar11._12_4_ * 0.055555556;
                auVar140._16_4_ = auVar11._16_4_ * 0.055555556;
                auVar140._20_4_ = auVar11._20_4_ * 0.055555556;
                auVar140._24_4_ = auVar11._24_4_ * 0.055555556;
                auVar140._28_4_ = auVar11._28_4_;
                auVar14._4_4_ = auVar139._4_4_ * 0.055555556;
                auVar14._0_4_ = auVar139._0_4_ * 0.055555556;
                auVar14._8_4_ = auVar139._8_4_ * 0.055555556;
                auVar14._12_4_ = auVar139._12_4_ * 0.055555556;
                auVar14._16_4_ = auVar139._16_4_ * 0.055555556;
                auVar14._20_4_ = auVar139._20_4_ * 0.055555556;
                auVar14._24_4_ = auVar139._24_4_ * 0.055555556;
                auVar14._28_4_ = auVar139._28_4_;
                auVar15._4_4_ = auVar141._4_4_ * 0.055555556;
                auVar15._0_4_ = auVar141._0_4_ * 0.055555556;
                auVar15._8_4_ = auVar141._8_4_ * 0.055555556;
                auVar15._12_4_ = auVar141._12_4_ * 0.055555556;
                auVar15._16_4_ = auVar141._16_4_ * 0.055555556;
                auVar15._20_4_ = auVar141._20_4_ * 0.055555556;
                auVar15._24_4_ = auVar141._24_4_ * 0.055555556;
                auVar15._28_4_ = auVar141._28_4_;
                auVar154 = vsubps_avx(auVar149,auVar140);
                auVar16 = vsubps_avx(auVar165,auVar14);
                auVar62 = vsubps_avx(auVar143,auVar15);
                auVar11 = vblendps_avx(auVar64,auVar119,0x80);
                auVar139 = vblendps_avx(auVar74,auVar119,0x80);
                auVar141 = vblendps_avx(auVar89,auVar119,0x80);
                auVar65._0_4_ = auVar149._0_4_ + auVar11._0_4_ * 0.055555556;
                auVar65._4_4_ = auVar149._4_4_ + auVar11._4_4_ * 0.055555556;
                auVar65._8_4_ = auVar149._8_4_ + auVar11._8_4_ * 0.055555556;
                auVar65._12_4_ = auVar149._12_4_ + auVar11._12_4_ * 0.055555556;
                auVar65._16_4_ = auVar149._16_4_ + auVar11._16_4_ * 0.055555556;
                auVar65._20_4_ = auVar149._20_4_ + auVar11._20_4_ * 0.055555556;
                auVar65._24_4_ = auVar149._24_4_ + auVar11._24_4_ * 0.055555556;
                auVar65._28_4_ = auVar149._28_4_ + auVar11._28_4_;
                auVar75._0_4_ = auVar165._0_4_ + auVar139._0_4_ * 0.055555556;
                auVar75._4_4_ = auVar165._4_4_ + auVar139._4_4_ * 0.055555556;
                auVar75._8_4_ = auVar165._8_4_ + auVar139._8_4_ * 0.055555556;
                auVar75._12_4_ = auVar165._12_4_ + auVar139._12_4_ * 0.055555556;
                auVar75._16_4_ = auVar165._16_4_ + auVar139._16_4_ * 0.055555556;
                auVar75._20_4_ = auVar165._20_4_ + auVar139._20_4_ * 0.055555556;
                auVar75._24_4_ = auVar165._24_4_ + auVar139._24_4_ * 0.055555556;
                auVar75._28_4_ = auVar165._28_4_ + auVar139._28_4_;
                auVar90._0_4_ = auVar143._0_4_ + auVar141._0_4_ * 0.055555556;
                auVar90._4_4_ = auVar143._4_4_ + auVar141._4_4_ * 0.055555556;
                auVar90._8_4_ = auVar143._8_4_ + auVar141._8_4_ * 0.055555556;
                auVar90._12_4_ = auVar143._12_4_ + auVar141._12_4_ * 0.055555556;
                auVar90._16_4_ = auVar143._16_4_ + auVar141._16_4_ * 0.055555556;
                auVar90._20_4_ = auVar143._20_4_ + auVar141._20_4_ * 0.055555556;
                auVar90._24_4_ = auVar143._24_4_ + auVar141._24_4_ * 0.055555556;
                auVar90._28_4_ = auVar143._28_4_ + auVar141._28_4_;
                auVar141._8_4_ = 0x7f800000;
                auVar141._0_8_ = 0x7f8000007f800000;
                auVar141._12_4_ = 0x7f800000;
                auVar141._16_4_ = 0x7f800000;
                auVar141._20_4_ = 0x7f800000;
                auVar141._24_4_ = 0x7f800000;
                auVar141._28_4_ = 0x7f800000;
                auVar11 = vminps_avx(auVar141,auVar149);
                auVar139 = vminps_avx(auVar141,auVar165);
                auVar141 = vminps_avx(auVar141,auVar143);
                auVar119 = vminps_avx(auVar154,auVar65);
                auVar140 = vminps_avx(auVar11,auVar119);
                auVar11 = vminps_avx(auVar16,auVar75);
                auVar14 = vminps_avx(auVar139,auVar11);
                auVar11 = vminps_avx(auVar62,auVar90);
                auVar15 = vminps_avx(auVar141,auVar11);
                auVar11 = vmaxps_avx(auVar154,auVar65);
                auVar154._8_4_ = 0xff800000;
                auVar154._0_8_ = 0xff800000ff800000;
                auVar154._12_4_ = 0xff800000;
                auVar154._16_4_ = 0xff800000;
                auVar154._20_4_ = 0xff800000;
                auVar154._24_4_ = 0xff800000;
                auVar154._28_4_ = 0xff800000;
                auVar139 = vmaxps_avx(auVar154,auVar149);
                auVar11 = vmaxps_avx(auVar139,auVar11);
                auVar139 = vmaxps_avx(auVar16,auVar75);
                auVar141 = vmaxps_avx(auVar154,auVar165);
                auVar139 = vmaxps_avx(auVar141,auVar139);
                auVar141 = vmaxps_avx(auVar62,auVar90);
                auVar119 = vmaxps_avx(auVar154,auVar143);
                auVar141 = vmaxps_avx(auVar119,auVar141);
                auVar119 = vshufps_avx(auVar140,auVar140,0xb1);
                auVar119 = vminps_avx(auVar140,auVar119);
                auVar118._8_4_ = 0xddccb9a2;
                auVar118._0_8_ = 0xddccb9a2ddccb9a2;
                auVar118._12_4_ = 0xddccb9a2;
                auVar140 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar140);
                auVar52 = vminps_avx(auVar119._0_16_,auVar119._16_16_);
                auVar119 = vshufps_avx(auVar14,auVar14,0xb1);
                auVar119 = vminps_avx(auVar14,auVar119);
                auVar140 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar140);
                auVar67 = vminps_avx(auVar119._0_16_,auVar119._16_16_);
                auVar67 = vunpcklps_avx(auVar52,auVar67);
                auVar119 = vshufps_avx(auVar15,auVar15,0xb1);
                auVar119 = vminps_avx(auVar15,auVar119);
                auVar137._8_4_ = 0x5dccb9a2;
                auVar137._0_8_ = 0x5dccb9a25dccb9a2;
                auVar137._12_4_ = 0x5dccb9a2;
                auVar128 = ZEXT864(0) << 0x20;
                auVar140 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar140);
                auVar52 = vminps_avx(auVar119._0_16_,auVar119._16_16_);
                auVar115 = ZEXT1664(local_1d8);
                auVar52 = vinsertps_avx(auVar67,auVar52,0x28);
                auVar53 = vminps_avx(local_258,auVar52);
                auVar119 = vshufps_avx(auVar11,auVar11,0xb1);
                auVar11 = vmaxps_avx(auVar11,auVar119);
                auVar119 = vshufpd_avx(auVar11,auVar11,5);
                auVar11 = vmaxps_avx(auVar11,auVar119);
                auVar52 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
                auVar11 = vshufps_avx(auVar139,auVar139,0xb1);
                auVar11 = vmaxps_avx(auVar139,auVar11);
                auVar139 = vshufpd_avx(auVar11,auVar11,5);
                auVar11 = vmaxps_avx(auVar11,auVar139);
                auVar67 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
                auVar110 = ZEXT1664(local_1c8);
                auVar67 = vunpcklps_avx(auVar52,auVar67);
                auVar11 = vshufps_avx(auVar141,auVar141,0xb1);
                auVar11 = vmaxps_avx(auVar141,auVar11);
                auVar139 = vshufpd_avx(auVar11,auVar11,5);
                auVar11 = vmaxps_avx(auVar11,auVar139);
                auVar52 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
                auVar52 = vinsertps_avx(auVar67,auVar52,0x28);
                auVar67 = vmaxps_avx(local_248,auVar52);
                auVar52 = vcmpps_avx(auVar53,auVar118,6);
                auVar67 = vcmpps_avx(auVar67,auVar137,1);
                auVar52 = vandps_avx(auVar67,auVar52);
                uVar41 = vmovmskps_avx(auVar52);
                if ((~(byte)uVar41 & 7) != 0) break;
                uVar43 = uVar43 + 1;
                bVar10 = (ulong)(long)(int)uVar44 < uVar43;
                if ((ulong)(long)(int)uVar44 < uVar43) break;
                lVar8 = *(long *)((long)&pBVar3[1].super_RawBufferView.ptr_ofs + lVar45);
                lVar9 = *(long *)((long)&pBVar3[1].super_RawBufferView.stride + lVar45);
                lVar45 = lVar45 + 0x38;
                auVar52 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
                pauVar50 = (undefined1 (*) [16])(lVar9 * uVar39 + lVar8);
                auVar67 = vcmpps_avx(auVar52,auVar118,2);
                auVar53 = vcmpps_avx(auVar52,auVar137,5);
                auVar67 = vorps_avx(auVar67,auVar53);
              } while ((((auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar67[0xf]);
            }
          }
          this = local_2e0;
          r = local_2c0;
          if (bVar10) {
            local_318.primID = &local_220;
            local_318.this = local_2e0;
            fVar66 = (local_2e0->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.super_Geometry.time_range.lower;
            local_218 = (local_2e0->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                        super_CurveGeometry.super_Geometry.time_range.upper - fVar66;
            fVar76 = (auVar110._0_4_ - fVar66) / local_218;
            local_218 = (auVar115._0_4_ - fVar66) / local_218;
            local_1b8 = fVar76;
            fVar76 = fVar1 * fVar76;
            local_2b8._0_4_ = fVar76;
            fVar66 = fVar1 * local_218;
            auVar51 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),9);
            local_308._0_4_ = fVar66;
            auVar67 = vroundss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66),10);
            auVar52 = vmaxss_avx(auVar51,auVar128._0_16_);
            local_1f8._0_4_ = auVar52._0_4_;
            auVar127 = vminss_avx(auVar67,ZEXT416((uint)fVar1));
            iVar40 = (int)auVar52._0_4_;
            local_2f8._0_4_ = auVar127._0_4_;
            iVar46 = (int)auVar127._0_4_;
            uVar42 = (int)auVar51._0_4_;
            if ((int)auVar51._0_4_ < 0) {
              uVar42 = 0xffffffff;
            }
            iVar49 = (int)fVar1 + 1;
            if ((int)auVar67._0_4_ < (int)fVar1 + 1) {
              iVar49 = (int)auVar67._0_4_;
            }
            local_220 = uVar48;
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_138.field_1,&local_318,(long)iVar40);
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_158.field_1,&local_318,(long)iVar46);
            if (iVar49 - uVar42 == 1) {
              auVar52 = vmaxss_avx(ZEXT416((uint)((float)local_2b8._0_4_ - (float)local_1f8._0_4_)),
                                   ZEXT816(0) << 0x40);
              auVar127 = vshufps_avx(auVar52,auVar52,0);
              auVar52 = ZEXT416((uint)(1.0 - auVar52._0_4_));
              auVar52 = vshufps_avx(auVar52,auVar52,0);
              auVar142._0_4_ =
                   auVar127._0_4_ * local_158.m128[0] + auVar52._0_4_ * local_138.m128[0];
              auVar142._4_4_ =
                   auVar127._4_4_ * local_158.m128[1] + auVar52._4_4_ * local_138.m128[1];
              auVar142._8_4_ =
                   auVar127._8_4_ * local_158.m128[2] + auVar52._8_4_ * local_138.m128[2];
              auVar142._12_4_ =
                   auVar127._12_4_ * local_158.m128[3] + auVar52._12_4_ * local_138.m128[3];
              auVar146._0_4_ = auVar127._0_4_ * local_148 + auVar52._0_4_ * local_128;
              auVar146._4_4_ = auVar127._4_4_ * fStack_144 + auVar52._4_4_ * fStack_124;
              auVar146._8_4_ = auVar127._8_4_ * fStack_140 + auVar52._8_4_ * fStack_120;
              auVar146._12_4_ = auVar127._12_4_ * fStack_13c + auVar52._12_4_ * fStack_11c;
              auVar52 = vmaxss_avx(ZEXT416((uint)((float)local_2f8._0_4_ - (float)local_308._0_4_)),
                                   ZEXT816(0) << 0x40);
              auVar127 = vshufps_avx(auVar52,auVar52,0);
              auVar52 = ZEXT416((uint)(1.0 - auVar52._0_4_));
              auVar52 = vshufps_avx(auVar52,auVar52,0);
              auVar85._0_4_ = auVar52._0_4_ * local_158.m128[0] + auVar127._0_4_ * local_138.m128[0]
              ;
              auVar85._4_4_ = auVar52._4_4_ * local_158.m128[1] + auVar127._4_4_ * local_138.m128[1]
              ;
              auVar85._8_4_ = auVar52._8_4_ * local_158.m128[2] + auVar127._8_4_ * local_138.m128[2]
              ;
              auVar85._12_4_ =
                   auVar52._12_4_ * local_158.m128[3] + auVar127._12_4_ * local_138.m128[3];
              auVar153._0_4_ = auVar52._0_4_ * local_148 + auVar127._0_4_ * local_128;
              auVar153._4_4_ = auVar52._4_4_ * fStack_144 + auVar127._4_4_ * fStack_124;
              auVar153._8_4_ = auVar52._8_4_ * fStack_140 + auVar127._8_4_ * fStack_120;
              auVar153._12_4_ = auVar52._12_4_ * fStack_13c + auVar127._12_4_ * fStack_11c;
              auVar127 = ZEXT416(0) << 0x20;
              auVar52 = ZEXT816(0) << 0x40;
            }
            else {
              local_2b8._0_4_ = (float)local_2b8._0_4_ - (float)local_1f8._0_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_58.field_1,&local_318,(long)(iVar40 + 1));
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_78.field_1,&local_318,(long)(iVar46 + -1));
              auVar52 = vmaxss_avx(ZEXT416((uint)local_2b8._0_4_),ZEXT816(0) << 0x40);
              auVar127 = vshufps_avx(auVar52,auVar52,0);
              auVar52 = ZEXT416((uint)(1.0 - auVar52._0_4_));
              auVar52 = vshufps_avx(auVar52,auVar52,0);
              auVar142._0_4_ = auVar127._0_4_ * local_58.m128[0] + auVar52._0_4_ * local_138.m128[0]
              ;
              auVar142._4_4_ = auVar127._4_4_ * local_58.m128[1] + auVar52._4_4_ * local_138.m128[1]
              ;
              auVar142._8_4_ = auVar127._8_4_ * local_58.m128[2] + auVar52._8_4_ * local_138.m128[2]
              ;
              auVar142._12_4_ =
                   auVar127._12_4_ * local_58.m128[3] + auVar52._12_4_ * local_138.m128[3];
              auVar146._0_4_ = auVar127._0_4_ * local_48 + auVar52._0_4_ * local_128;
              auVar146._4_4_ = auVar127._4_4_ * fStack_44 + auVar52._4_4_ * fStack_124;
              auVar146._8_4_ = auVar127._8_4_ * fStack_40 + auVar52._8_4_ * fStack_120;
              auVar146._12_4_ = auVar127._12_4_ * fStack_3c + auVar52._12_4_ * fStack_11c;
              auVar52 = vmaxss_avx(ZEXT416((uint)((float)local_2f8._0_4_ - (float)local_308._0_4_)),
                                   ZEXT816(0) << 0x40);
              auVar127 = vshufps_avx(auVar52,auVar52,0);
              auVar52 = ZEXT416((uint)(1.0 - auVar52._0_4_));
              auVar52 = vshufps_avx(auVar52,auVar52,0);
              auVar85._0_4_ = auVar127._0_4_ * local_78.m128[0] + auVar52._0_4_ * local_158.m128[0];
              auVar85._4_4_ = auVar127._4_4_ * local_78.m128[1] + auVar52._4_4_ * local_158.m128[1];
              auVar85._8_4_ = auVar127._8_4_ * local_78.m128[2] + auVar52._8_4_ * local_158.m128[2];
              auVar85._12_4_ =
                   auVar127._12_4_ * local_78.m128[3] + auVar52._12_4_ * local_158.m128[3];
              auVar153._0_4_ = auVar127._0_4_ * local_68 + auVar52._0_4_ * local_148;
              auVar153._4_4_ = auVar127._4_4_ * fStack_64 + auVar52._4_4_ * fStack_144;
              auVar153._8_4_ = auVar127._8_4_ * fStack_60 + auVar52._8_4_ * fStack_140;
              auVar153._12_4_ = auVar127._12_4_ * fStack_5c + auVar52._12_4_ * fStack_13c;
              if ((int)(uVar42 + 1) < iVar49) {
                local_198 = local_218 - local_1b8;
                sVar47 = (size_t)(uVar42 + 1);
                iVar49 = ~uVar42 + iVar49;
                do {
                  _local_1f8 = auVar153;
                  _local_2b8 = auVar146;
                  _local_2f8 = auVar142;
                  auVar61._0_4_ = ((float)(int)sVar47 / fVar1 - local_1b8) / local_198;
                  auVar61._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar52 = vshufps_avx(auVar61,auVar61,0);
                  local_308._0_4_ = auVar85._0_4_;
                  local_308._4_4_ = auVar85._4_4_;
                  fStack_300 = auVar85._8_4_;
                  fStack_2fc = auVar85._12_4_;
                  auVar127 = vshufps_avx(ZEXT416((uint)(1.0 - auVar61._0_4_)),
                                         ZEXT416((uint)(1.0 - auVar61._0_4_)),0);
                  local_218 = auVar52._0_4_ * (float)local_308._0_4_ +
                              local_2f8._0_4_ * auVar127._0_4_;
                  fStack_214 = auVar52._4_4_ * (float)local_308._4_4_ +
                               local_2f8._4_4_ * auVar127._4_4_;
                  fStack_210 = auVar52._8_4_ * fStack_300 + local_2f8._8_4_ * auVar127._8_4_;
                  fStack_20c = auVar52._12_4_ * fStack_2fc + local_2f8._12_4_ * auVar127._12_4_;
                  local_178 = local_1f8._0_4_ * auVar52._0_4_ + local_2b8._0_4_ * auVar127._0_4_;
                  fStack_174 = local_1f8._4_4_ * auVar52._4_4_ + local_2b8._4_4_ * auVar127._4_4_;
                  fStack_170 = local_1f8._8_4_ * auVar52._8_4_ + local_2b8._8_4_ * auVar127._8_4_;
                  fStack_16c = local_1f8._12_4_ * auVar52._12_4_ +
                               local_2b8._12_4_ * auVar127._12_4_;
                  _local_308 = auVar85;
                  linearBounds::anon_class_16_2_07cfa4d6::operator()
                            ((BBox3fa *)&local_98.field_1,&local_318,sVar47);
                  auVar52 = ZEXT816(0) << 0x40;
                  auVar127._4_4_ = fStack_214;
                  auVar127._0_4_ = local_218;
                  auVar127._8_4_ = fStack_210;
                  auVar127._12_4_ = fStack_20c;
                  auVar127 = vsubps_avx((undefined1  [16])local_98,auVar127);
                  auVar17._4_4_ = fStack_174;
                  auVar17._0_4_ = local_178;
                  auVar17._8_4_ = fStack_170;
                  auVar17._12_4_ = fStack_16c;
                  auVar67 = vsubps_avx(local_88,auVar17);
                  auVar51 = vminps_avx(auVar127,auVar52);
                  auVar127 = vmaxps_avx(auVar67,auVar52);
                  auVar142._0_4_ = (float)local_2f8._0_4_ + auVar51._0_4_;
                  auVar142._4_4_ = (float)local_2f8._4_4_ + auVar51._4_4_;
                  auVar142._8_4_ = fStack_2f0 + auVar51._8_4_;
                  auVar142._12_4_ = fStack_2ec + auVar51._12_4_;
                  auVar85._0_4_ = (float)local_308._0_4_ + auVar51._0_4_;
                  auVar85._4_4_ = (float)local_308._4_4_ + auVar51._4_4_;
                  auVar85._8_4_ = fStack_300 + auVar51._8_4_;
                  auVar85._12_4_ = fStack_2fc + auVar51._12_4_;
                  auVar146._0_4_ = (float)local_2b8._0_4_ + auVar127._0_4_;
                  auVar146._4_4_ = (float)local_2b8._4_4_ + auVar127._4_4_;
                  auVar146._8_4_ = fStack_2b0 + auVar127._8_4_;
                  auVar146._12_4_ = fStack_2ac + auVar127._12_4_;
                  auVar153._0_4_ = (float)local_1f8._0_4_ + auVar127._0_4_;
                  auVar153._4_4_ = (float)local_1f8._4_4_ + auVar127._4_4_;
                  auVar153._8_4_ = fStack_1f0 + auVar127._8_4_;
                  auVar153._12_4_ = fStack_1ec + auVar127._12_4_;
                  sVar47 = sVar47 + 1;
                  iVar49 = iVar49 + -1;
                } while (iVar49 != 0);
              }
              else {
                auVar52 = ZEXT816(0) << 0x40;
              }
              auVar127 = ZEXT816(0) << 0x40;
            }
            auVar177 = ZEXT1664(auVar52);
            auVar128 = ZEXT1664(auVar127);
            auVar52 = vcmpps_avx(auVar142,auVar146,2);
            uVar41 = vmovmskps_avx(auVar52);
            auVar110 = ZEXT1664(local_1c8);
            auVar115 = ZEXT1664(local_1d8);
            this = local_2e0;
            r = local_2c0;
            if ((~(byte)uVar41 & 7) == 0) {
              auVar52 = vcmpps_avx(auVar85,auVar153,2);
              uVar41 = vmovmskps_avx(auVar52);
              if ((~(byte)uVar41 & 7) == 0) {
                auVar52 = vminps_avx(auVar142,auVar85);
                aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                         vinsertps_avx(auVar52,ZEXT416(geomID),0x30);
                auVar52 = vmaxps_avx(auVar146,auVar153);
                aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                         vinsertps_avx(auVar52,ZEXT416((uint)uVar48),0x30);
                auVar86._0_4_ = aVar12.x + aVar13.x;
                auVar86._4_4_ = aVar12.y + aVar13.y;
                auVar86._8_4_ = aVar12.z + aVar13.z;
                auVar86._12_4_ = aVar12.field_3.w + aVar13.field_3.w;
                local_268 = vminps_avx(local_268,(undefined1  [16])aVar12);
                local_278 = vmaxps_avx(local_278,(undefined1  [16])aVar13);
                local_288 = vminps_avx(local_288,auVar86);
                local_298 = vmaxps_avx(local_298,auVar86);
                local_2d0 = local_2d0 + 1;
                local_228[local_2c8].lower.field_0.field_1 = aVar12;
                local_228[local_2c8].upper.field_0.field_1 = aVar13;
                local_2c8 = local_2c8 + 1;
              }
            }
          }
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 < r->_end);
    }
    *(undefined8 *)
     &(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
         local_268._0_8_;
    *(undefined8 *)
     ((long)&(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8
     ) = local_268._8_8_;
    *(undefined8 *)
     &(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
         local_278._0_8_;
    *(undefined8 *)
     ((long)&(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8
     ) = local_278._8_8_;
    *(undefined8 *)
     &(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
         local_288._0_8_;
    *(undefined8 *)
     ((long)&(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8
     ) = local_288._8_8_;
    *(undefined8 *)
     &(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
         local_298._0_8_;
    *(undefined8 *)
     ((long)&(local_230->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 + 8
     ) = local_298._8_8_;
    local_230->end = local_2d0;
    __return_storage_ptr__ = local_230;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }